

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int * Dau_DsdComputeMatches(char *p)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  char *__assertion;
  int *piVar4;
  int iVar5;
  int pNested [12];
  
  lVar2 = 0;
  piVar4 = Dau_DsdComputeMatches::pMatches;
  iVar5 = 0;
  do {
    if (p[lVar2] == '\0') {
      if (iVar5 == 0) {
        return Dau_DsdComputeMatches::pMatches;
      }
      __assertion = "nNested == 0";
      uVar3 = 0x5e;
LAB_0043141d:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                    ,uVar3,"int *Dau_DsdComputeMatches(char *)");
    }
    *piVar4 = 0;
    bVar1 = p[lVar2];
    uVar3 = bVar1 - 0x28;
    if (uVar3 < 0x36) {
      if ((0x8000000100001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_004313de;
      if ((0x20000000400002U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_004313c3;
LAB_004313cf:
      Dau_DsdComputeMatches::pMatches[pNested[(long)iVar5 + -1]] = (int)lVar2;
      iVar5 = iVar5 + -1;
    }
    else {
LAB_004313c3:
      if (bVar1 == 0x7b) {
LAB_004313de:
        pNested[iVar5] = (int)lVar2;
        if (10 < iVar5) {
          __assertion = "nNested < DAU_MAX_VAR";
          uVar3 = 0x5c;
          goto LAB_0043141d;
        }
        iVar5 = iVar5 + 1;
      }
      else if (bVar1 == 0x7d) goto LAB_004313cf;
    }
    lVar2 = lVar2 + 1;
    piVar4 = piVar4 + 1;
  } while( true );
}

Assistant:

int * Dau_DsdComputeMatches( char * p )
{
    static int pMatches[DAU_MAX_STR];
    int pNested[DAU_MAX_VAR];
    int v, nNested = 0;
    for ( v = 0; p[v]; v++ )
    {
        pMatches[v] = 0;
        if ( p[v] == '(' || p[v] == '[' || p[v] == '<' || p[v] == '{' )
            pNested[nNested++] = v;
        else if ( p[v] == ')' || p[v] == ']' || p[v] == '>' || p[v] == '}' )
            pMatches[pNested[--nNested]] = v;
        assert( nNested < DAU_MAX_VAR );
    }
    assert( nNested == 0 );
    return pMatches;
}